

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReturnValues.cc
# Opt level: O0

void __thiscall Calculator::~Calculator(Calculator *this)

{
  BasicSignal<int_(),_std::lock_guard<std::mutex>_> *in_stack_00000030;
  
  sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::~BasicSignal(in_stack_00000030);
  return;
}

Assistant:

void execute()
  {
    std::cout << "Calculating.." << std::endl;

    int sum = 0;
    executeSignal_([&sum](int retVal) {
      std::cout << "Incoming value: " << retVal << std::endl;
      sum += retVal;
    });

    std::cout << "Sum of calculation: " << sum << std::endl;
  }